

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# point_source_panner.cpp
# Opt level: O0

void __thiscall
ear::PointSourcePannerDownmix::PointSourcePannerDownmix
          (PointSourcePannerDownmix *this,shared_ptr<ear::PointSourcePanner> *psp,MatrixXd *downmix)

{
  MatrixXd *downmix_local;
  shared_ptr<ear::PointSourcePanner> *psp_local;
  PointSourcePannerDownmix *this_local;
  
  PointSourcePanner::PointSourcePanner(&this->super_PointSourcePanner);
  (this->super_PointSourcePanner)._vptr_PointSourcePanner = (_func_int **)&PTR_handle_003d75f8;
  std::shared_ptr<ear::PointSourcePanner>::shared_ptr(&this->_psp,psp);
  Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::Matrix(&this->_downmix,downmix);
  return;
}

Assistant:

PointSourcePannerDownmix::PointSourcePannerDownmix(
      std::shared_ptr<PointSourcePanner> psp, Eigen::MatrixXd downmix)
      : _psp(psp), _downmix(downmix){}